

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

CURLcode Curl_SOCKS5(char *proxy_user,char *proxy_password,char *hostname,int remote_port,
                    int sockindex,connectdata *conn)

{
  byte bVar1;
  sockaddr *psVar2;
  unsigned_long uVar3;
  int iVar4;
  long lVar5;
  size_t len_00;
  uchar port_upper;
  int addrlen;
  sockaddr_in6 *saddr_in6;
  int i_1;
  sockaddr_in *saddr_in;
  char local_388 [4];
  int i;
  char buf [64];
  Curl_addrinfo *pCStack_338;
  int rc;
  Curl_addrinfo *hp;
  Curl_dns_entry *dns;
  size_t proxy_password_len;
  size_t proxy_user_len;
  ulong uStack_310;
  _Bool allow_gssapi;
  unsigned_long auth;
  ssize_t len;
  size_t hostname_len;
  timediff_t tStack_2f0;
  _Bool socks5_resolve_local;
  timediff_t timeout;
  Curl_easy *data;
  CURLcode local_2d8;
  curl_socket_t sock;
  CURLcode code;
  int result;
  ssize_t written;
  ssize_t actualread;
  byte local_2b8 [4];
  int idx;
  uchar socksreq [600];
  connectdata *conn_local;
  int sockindex_local;
  int remote_port_local;
  char *hostname_local;
  char *proxy_password_local;
  char *proxy_user_local;
  
  data._4_4_ = conn->sock[sockindex];
  timeout = (timediff_t)conn->data;
  hostname_len._7_1_ = (conn->socks_proxy).proxytype == CURLPROXY_SOCKS5;
  socksreq._592_8_ = conn;
  len = strlen(hostname);
  auth = 0;
  uStack_310 = *(ulong *)(timeout + 0x6c0);
  proxy_user_len._7_1_ = 0;
  if ((*(uint *)(socksreq._592_8_ + 0x3ac) >> 5 & 1) != 0) {
    Curl_infof(*(Curl_easy **)socksreq._592_8_,"SOCKS5: connecting to HTTP proxy %s port %d\n",
               hostname,(ulong)(uint)remote_port);
  }
  if (((hostname_len._7_1_ & 1) == 0) && (0xff < (ulong)len)) {
    Curl_infof(*(Curl_easy **)socksreq._592_8_,
               "SOCKS5: server resolving disabled for hostnames of length > 255 [actual len=%zu]\n",
               len);
    hostname_len._7_1_ = 1;
  }
  tStack_2f0 = Curl_timeleft((Curl_easy *)timeout,(curltime *)0x0,true);
  if (tStack_2f0 < 0) {
    Curl_failf((Curl_easy *)timeout,"Connection time-out");
    proxy_user_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    curlx_nonblock(data._4_4_,1);
    sock = Curl_socket_check(-1,-1,data._4_4_,tStack_2f0);
    if (sock == 0xffffffff) {
      Curl_failf(*(Curl_easy **)socksreq._592_8_,"SOCKS5: no connection here");
      proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
    }
    else if (sock == 0) {
      Curl_failf(*(Curl_easy **)socksreq._592_8_,"SOCKS5: connection timeout");
      proxy_user_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
    }
    else if ((sock & 4U) == 0) {
      if ((uStack_310 & 0xfffffffffffffffa) != 0) {
        Curl_infof(*(Curl_easy **)socksreq._592_8_,
                   "warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu\n",uStack_310);
      }
      proxy_password_local = proxy_user;
      if ((uStack_310 & 1) == 0) {
        proxy_password_local = (char *)0x0;
      }
      local_2b8[0] = 5;
      actualread._4_4_ = 3;
      local_2b8[2] = 0;
      if ((proxy_user_len._7_1_ & 1) != 0) {
        actualread._4_4_ = 4;
        local_2b8[3] = '\x01';
      }
      if (proxy_password_local != (char *)0x0) {
        local_2b8[actualread._4_4_] = 2;
        actualread._4_4_ = actualread._4_4_ + 1;
      }
      local_2b8[1] = (char)actualread._4_4_ - 2;
      curlx_nonblock(data._4_4_,0);
      Curl_infof((Curl_easy *)timeout,"SOCKS5 communication to %s:%d\n",hostname,
                 (ulong)(uint)remote_port);
      local_2d8 = Curl_write_plain((connectdata *)socksreq._592_8_,data._4_4_,local_2b8,
                                   (long)(int)(local_2b8[1] + 2),(ssize_t *)&code);
      if ((local_2d8 == CURLE_OK) && (_code == (long)(int)(local_2b8[1] + 2))) {
        curlx_nonblock(data._4_4_,1);
        sock = Curl_socket_check(data._4_4_,-1,-1,tStack_2f0);
        if (sock == 0xffffffff) {
          Curl_failf(*(Curl_easy **)socksreq._592_8_,"SOCKS5 nothing to read");
          proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
        }
        else if (sock == 0) {
          Curl_failf(*(Curl_easy **)socksreq._592_8_,"SOCKS5 read timeout");
          proxy_user_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
        }
        else if ((sock & 4U) == 0) {
          curlx_nonblock(data._4_4_,0);
          sock = Curl_blockread_all((connectdata *)socksreq._592_8_,data._4_4_,(char *)local_2b8,2,
                                    &written);
          if ((sock == 0) && (written == 2)) {
            if (local_2b8[0] == 5) {
              if (local_2b8[1] != 0) {
                if (local_2b8[1] != 2) {
                  if (((proxy_user_len._7_1_ & 1) == 0) && (local_2b8[1] == 1)) {
                    Curl_failf((Curl_easy *)timeout,
                               "SOCKS5 GSSAPI per-message authentication is not supported.");
                    return CURLE_COULDNT_CONNECT;
                  }
                  if (local_2b8[1] == 0xff) {
                    if ((proxy_password_local == (char *)0x0) || (*proxy_password_local == '\0')) {
                      Curl_failf((Curl_easy *)timeout,
                                 "No authentication method was acceptable. (It is quite likely that the SOCKS5 server wanted a username/password, since none was supplied to the server on this connection.)"
                                );
                    }
                    else {
                      Curl_failf((Curl_easy *)timeout,"No authentication method was acceptable.");
                    }
                    return CURLE_COULDNT_CONNECT;
                  }
                  Curl_failf((Curl_easy *)timeout,
                             "Undocumented SOCKS5 mode attempted to be used by server.");
                  return CURLE_COULDNT_CONNECT;
                }
                if ((proxy_password_local == (char *)0x0) || (proxy_password == (char *)0x0)) {
                  proxy_password_len = 0;
                  dns = (Curl_dns_entry *)0x0;
                }
                else {
                  proxy_password_len = strlen(proxy_password_local);
                  dns = (Curl_dns_entry *)strlen(proxy_password);
                }
                local_2b8[0] = 1;
                local_2b8[1] = (byte)proxy_password_len;
                auth = 2;
                if ((proxy_password_local != (char *)0x0) && (proxy_password_len != 0)) {
                  if (0xfe < proxy_password_len) {
                    Curl_failf((Curl_easy *)timeout,"Excessive user name length for proxy auth");
                    return CURLE_BAD_FUNCTION_ARGUMENT;
                  }
                  memcpy(local_2b8 + 2,proxy_password_local,proxy_password_len);
                }
                lVar5 = proxy_password_len + auth;
                auth = lVar5 + 1;
                local_2b8[lVar5] = (byte)dns;
                if ((proxy_password != (char *)0x0) && (dns != (Curl_dns_entry *)0x0)) {
                  if ((Curl_dns_entry *)0xff < dns) {
                    Curl_failf((Curl_easy *)timeout,"Excessive password length for proxy auth");
                    return CURLE_BAD_FUNCTION_ARGUMENT;
                  }
                  memcpy(local_2b8 + lVar5 + 1,proxy_password,(size_t)dns);
                }
                auth = (long)&dns->addr + auth;
                local_2d8 = Curl_write_plain((connectdata *)socksreq._592_8_,data._4_4_,local_2b8,
                                             auth,(ssize_t *)&code);
                if ((local_2d8 != CURLE_OK) || (auth != _code)) {
                  Curl_failf((Curl_easy *)timeout,"Failed to send SOCKS5 sub-negotiation request.");
                  return CURLE_COULDNT_CONNECT;
                }
                sock = Curl_blockread_all((connectdata *)socksreq._592_8_,data._4_4_,
                                          (char *)local_2b8,2,&written);
                if ((sock != 0) || (written != 2)) {
                  Curl_failf((Curl_easy *)timeout,
                             "Unable to receive SOCKS5 sub-negotiation response.");
                  return CURLE_COULDNT_CONNECT;
                }
                if (local_2b8[1] != 0) {
                  Curl_failf((Curl_easy *)timeout,"User was rejected by the SOCKS5 server (%d %d).",
                             (ulong)local_2b8[0],(ulong)local_2b8[1]);
                  return CURLE_COULDNT_CONNECT;
                }
              }
              sock = 0;
              local_2b8[0] = 5;
              local_2b8[1] = 1;
              auth = 3;
              local_2b8[2] = 0;
              if ((hostname_len._7_1_ & 1) == 0) {
                local_2b8[3] = '\x03';
                idx._0_1_ = (byte)len;
                auth = 5;
                memcpy((void *)((long)&idx + 1),hostname,len);
                auth = len + auth;
              }
              else {
                pCStack_338 = (Curl_addrinfo *)0x0;
                iVar4 = Curl_resolv((connectdata *)socksreq._592_8_,hostname,remote_port,false,
                                    (Curl_dns_entry **)&hp);
                if (iVar4 == -1) {
                  return CURLE_COULDNT_RESOLVE_HOST;
                }
                if (iVar4 == 1) {
                  return CURLE_COULDNT_RESOLVE_HOST;
                }
                if (hp != (Curl_addrinfo *)0x0) {
                  pCStack_338 = *(Curl_addrinfo **)hp;
                }
                if (pCStack_338 != (Curl_addrinfo *)0x0) {
                  Curl_printable_address(pCStack_338,local_388,0x40);
                  if (pCStack_338->ai_family == 2) {
                    local_2b8[auth] = 1;
                    psVar2 = pCStack_338->ai_addr;
                    uVar3 = auth;
                    for (saddr_in._4_4_ = 0; auth = uVar3 + 1, saddr_in._4_4_ < 4;
                        saddr_in._4_4_ = saddr_in._4_4_ + 1) {
                      local_2b8[uVar3 + 1] = psVar2->sa_data[(long)saddr_in._4_4_ + 2];
                      uVar3 = auth;
                    }
                    Curl_infof((Curl_easy *)timeout,"SOCKS5 connect to IPv4 %s (locally resolved)\n"
                               ,local_388);
                  }
                  else if (pCStack_338->ai_family == 10) {
                    local_2b8[auth] = 4;
                    psVar2 = pCStack_338->ai_addr;
                    uVar3 = auth;
                    for (saddr_in6._4_4_ = 0; auth = uVar3 + 1, saddr_in6._4_4_ < 0x10;
                        saddr_in6._4_4_ = saddr_in6._4_4_ + 1) {
                      local_2b8[uVar3 + 1] = psVar2->sa_data[(long)saddr_in6._4_4_ + 6];
                      uVar3 = auth;
                    }
                    Curl_infof((Curl_easy *)timeout,"SOCKS5 connect to IPv6 %s (locally resolved)\n"
                               ,local_388);
                  }
                  else {
                    pCStack_338 = (Curl_addrinfo *)0x0;
                    Curl_failf((Curl_easy *)timeout,"SOCKS5 connection to %s not supported\n",
                               local_388);
                  }
                  Curl_resolv_unlock((Curl_easy *)timeout,(Curl_dns_entry *)hp);
                }
                if (pCStack_338 == (Curl_addrinfo *)0x0) {
                  Curl_failf((Curl_easy *)timeout,"Failed to resolve \"%s\" for SOCKS5 connect.",
                             hostname);
                  return CURLE_COULDNT_RESOLVE_HOST;
                }
              }
              local_2b8[auth] = (byte)((uint)remote_port >> 8);
              len_00 = auth + 2;
              local_2b8[auth + 1] = (byte)remote_port;
              auth = len_00;
              local_2d8 = Curl_write_plain((connectdata *)socksreq._592_8_,data._4_4_,local_2b8,
                                           len_00,(ssize_t *)&code);
              if ((local_2d8 == CURLE_OK) && (auth == _code)) {
                auth = 10;
                sock = Curl_blockread_all((connectdata *)socksreq._592_8_,data._4_4_,
                                          (char *)local_2b8,10,&written);
                if ((sock == 0) && (auth == written)) {
                  if (local_2b8[0] == 5) {
                    if (local_2b8[3] == '\x03') {
                      auth = (long)(int)((byte)idx + 7);
                    }
                    else if (local_2b8[3] == '\x04') {
                      auth = 0x16;
                    }
                    if (10 < (long)auth) {
                      sock = Curl_blockread_all((connectdata *)socksreq._592_8_,data._4_4_,
                                                (char *)(socksreq + 2),auth - 10,&written);
                      if ((sock != 0) || (auth - 10 != written)) {
                        Curl_failf((Curl_easy *)timeout,
                                   "Failed to receive SOCKS5 connect request ack.");
                        return CURLE_COULDNT_CONNECT;
                      }
                    }
                    if (local_2b8[1] == 0) {
                      Curl_infof((Curl_easy *)timeout,"SOCKS5 request granted.\n");
                      curlx_nonblock(data._4_4_,1);
                      proxy_user_local._4_4_ = CURLE_OK;
                    }
                    else {
                      if (local_2b8[3] == '\x01') {
                        Curl_failf((Curl_easy *)timeout,
                                   "Can\'t complete SOCKS5 connection to %d.%d.%d.%d:%d. (%d)",
                                   (ulong)(byte)idx,(ulong)idx._1_1_,(ulong)idx._2_1_,
                                   (ulong)idx._3_1_,(uint)CONCAT11(socksreq[0],socksreq[1]),
                                   (uint)local_2b8[1]);
                      }
                      else if (local_2b8[3] == '\x03') {
                        bVar1 = local_2b8[auth - 2];
                        local_2b8[auth - 2] = 0;
                        Curl_failf((Curl_easy *)timeout,
                                   "Can\'t complete SOCKS5 connection to %s:%d. (%d)",(long)&idx + 1
                                   ,(ulong)CONCAT11(bVar1,local_2b8[auth - 1]),(ulong)local_2b8[1]);
                        local_2b8[auth - 2] = bVar1;
                      }
                      else if (local_2b8[3] == '\x04') {
                        Curl_failf((Curl_easy *)timeout,
                                   "Can\'t complete SOCKS5 connection to %02x%02x:%02x%02x:%02x%02x:%02x%02x:%02x%02x:%02x%02x:%02x%02x:%02x%02x:%d. (%d)"
                                   ,(ulong)(byte)idx,(ulong)idx._1_1_,(ulong)idx._2_1_,
                                   (ulong)idx._3_1_,(uint)socksreq[0],(uint)socksreq[1],
                                   (uint)socksreq[2],(uint)socksreq[3],(uint)socksreq[4],
                                   (uint)socksreq[5],(uint)socksreq[6],(uint)socksreq[7],
                                   (uint)socksreq[8],(uint)socksreq[9],(uint)socksreq[10],
                                   (uint)socksreq[0xb],(uint)CONCAT11(socksreq[0xc],socksreq[0xd]),
                                   (uint)local_2b8[1]);
                      }
                      proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
                    }
                  }
                  else {
                    Curl_failf((Curl_easy *)timeout,
                               "SOCKS5 reply has wrong version, version should be 5.");
                    proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
                  }
                }
                else {
                  Curl_failf((Curl_easy *)timeout,"Failed to receive SOCKS5 connect request ack.");
                  proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
                }
              }
              else {
                Curl_failf((Curl_easy *)timeout,"Failed to send SOCKS5 connect request.");
                proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
              }
            }
            else {
              Curl_failf((Curl_easy *)timeout,"Received invalid version in initial SOCKS5 response."
                        );
              proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
            }
          }
          else {
            Curl_failf((Curl_easy *)timeout,"Unable to receive initial SOCKS5 response.");
            proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
          }
        }
        else {
          Curl_failf(*(Curl_easy **)socksreq._592_8_,"SOCKS5 read error occurred");
          proxy_user_local._4_4_ = CURLE_RECV_ERROR;
        }
      }
      else {
        Curl_failf((Curl_easy *)timeout,"Unable to send initial SOCKS5 request.");
        proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
      }
    }
    else {
      Curl_failf(*(Curl_easy **)socksreq._592_8_,"SOCKS5: error occurred during connection");
      proxy_user_local._4_4_ = CURLE_COULDNT_CONNECT;
    }
  }
  return proxy_user_local._4_4_;
}

Assistant:

CURLcode Curl_SOCKS5(const char *proxy_user,
                     const char *proxy_password,
                     const char *hostname,
                     int remote_port,
                     int sockindex,
                     struct connectdata *conn)
{
  /*
    According to the RFC1928, section "6.  Replies". This is what a SOCK5
    replies:

        +----+-----+-------+------+----------+----------+
        |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
        +----+-----+-------+------+----------+----------+
        | 1  |  1  | X'00' |  1   | Variable |    2     |
        +----+-----+-------+------+----------+----------+

    Where:

    o  VER    protocol version: X'05'
    o  REP    Reply field:
    o  X'00' succeeded
  */

  unsigned char socksreq[600]; /* room for large user/pw (255 max each) */
  int idx;
  ssize_t actualread;
  ssize_t written;
  int result;
  CURLcode code;
  curl_socket_t sock = conn->sock[sockindex];
  struct Curl_easy *data = conn->data;
  timediff_t timeout;
  bool socks5_resolve_local =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS5) ? TRUE : FALSE;
  const size_t hostname_len = strlen(hostname);
  ssize_t len = 0;
  const unsigned long auth = data->set.socks5auth;
  bool allow_gssapi = FALSE;

  if(conn->bits.httpproxy)
    infof(conn->data, "SOCKS5: connecting to HTTP proxy %s port %d\n",
          hostname, remote_port);

  /* RFC1928 chapter 5 specifies max 255 chars for domain name in packet */
  if(!socks5_resolve_local && hostname_len > 255) {
    infof(conn->data, "SOCKS5: server resolving disabled for hostnames of "
          "length > 255 [actual len=%zu]\n", hostname_len);
    socks5_resolve_local = TRUE;
  }

  /* get timeout */
  timeout = Curl_timeleft(data, NULL, TRUE);

  if(timeout < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  (void)curlx_nonblock(sock, TRUE);

  /* wait until socket gets connected */
  result = SOCKET_WRITABLE(sock, timeout);

  if(-1 == result) {
    failf(conn->data, "SOCKS5: no connection here");
    return CURLE_COULDNT_CONNECT;
  }
  if(0 == result) {
    failf(conn->data, "SOCKS5: connection timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(result & CURL_CSELECT_ERR) {
    failf(conn->data, "SOCKS5: error occurred during connection");
    return CURLE_COULDNT_CONNECT;
  }

  if(auth & ~(CURLAUTH_BASIC | CURLAUTH_GSSAPI))
    infof(conn->data,
        "warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu\n",
        auth);
  if(!(auth & CURLAUTH_BASIC))
    /* disable username/password auth */
    proxy_user = NULL;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  if(auth & CURLAUTH_GSSAPI)
    allow_gssapi = TRUE;
#endif

  idx = 0;
  socksreq[idx++] = 5;   /* version */
  idx++;                 /* reserve for the number of authentication methods */
  socksreq[idx++] = 0;   /* no authentication */
  if(allow_gssapi)
    socksreq[idx++] = 1; /* GSS-API */
  if(proxy_user)
    socksreq[idx++] = 2; /* username/password */
  /* write the number of authentication methods */
  socksreq[1] = (unsigned char) (idx - 2);

  (void)curlx_nonblock(sock, FALSE);

  infof(data, "SOCKS5 communication to %s:%d\n", hostname, remote_port);

  code = Curl_write_plain(conn, sock, (char *)socksreq, (2 + (int)socksreq[1]),
                          &written);
  if(code || (written != (2 + (int)socksreq[1]))) {
    failf(data, "Unable to send initial SOCKS5 request.");
    return CURLE_COULDNT_CONNECT;
  }

  (void)curlx_nonblock(sock, TRUE);

  result = SOCKET_READABLE(sock, timeout);

  if(-1 == result) {
    failf(conn->data, "SOCKS5 nothing to read");
    return CURLE_COULDNT_CONNECT;
  }
  if(0 == result) {
    failf(conn->data, "SOCKS5 read timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(result & CURL_CSELECT_ERR) {
    failf(conn->data, "SOCKS5 read error occurred");
    return CURLE_RECV_ERROR;
  }

  (void)curlx_nonblock(sock, FALSE);

  result = Curl_blockread_all(conn, sock, (char *)socksreq, 2, &actualread);
  if(result || (actualread != 2)) {
    failf(data, "Unable to receive initial SOCKS5 response.");
    return CURLE_COULDNT_CONNECT;
  }

  if(socksreq[0] != 5) {
    failf(data, "Received invalid version in initial SOCKS5 response.");
    return CURLE_COULDNT_CONNECT;
  }
  if(socksreq[1] == 0) {
    /* Nothing to do, no authentication needed */
    ;
  }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  else if(allow_gssapi && (socksreq[1] == 1)) {
    code = Curl_SOCKS5_gssapi_negotiate(sockindex, conn);
    if(code) {
      failf(data, "Unable to negotiate SOCKS5 GSS-API context.");
      return CURLE_COULDNT_CONNECT;
    }
  }
#endif
  else if(socksreq[1] == 2) {
    /* Needs user name and password */
    size_t proxy_user_len, proxy_password_len;
    if(proxy_user && proxy_password) {
      proxy_user_len = strlen(proxy_user);
      proxy_password_len = strlen(proxy_password);
    }
    else {
      proxy_user_len = 0;
      proxy_password_len = 0;
    }

    /*   username/password request looks like
     * +----+------+----------+------+----------+
     * |VER | ULEN |  UNAME   | PLEN |  PASSWD  |
     * +----+------+----------+------+----------+
     * | 1  |  1   | 1 to 255 |  1   | 1 to 255 |
     * +----+------+----------+------+----------+
     */
    len = 0;
    socksreq[len++] = 1;    /* username/pw subnegotiation version */
    socksreq[len++] = (unsigned char) proxy_user_len;
    if(proxy_user && proxy_user_len) {
      /* the length must fit in a single byte */
      if(proxy_user_len >= 255) {
        failf(data, "Excessive user name length for proxy auth");
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      memcpy(socksreq + len, proxy_user, proxy_user_len);
    }
    len += proxy_user_len;
    socksreq[len++] = (unsigned char) proxy_password_len;
    if(proxy_password && proxy_password_len) {
      /* the length must fit in a single byte */
      if(proxy_password_len > 255) {
        failf(data, "Excessive password length for proxy auth");
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      memcpy(socksreq + len, proxy_password, proxy_password_len);
    }
    len += proxy_password_len;

    code = Curl_write_plain(conn, sock, (char *)socksreq, len, &written);
    if(code || (len != written)) {
      failf(data, "Failed to send SOCKS5 sub-negotiation request.");
      return CURLE_COULDNT_CONNECT;
    }

    result = Curl_blockread_all(conn, sock, (char *)socksreq, 2, &actualread);
    if(result || (actualread != 2)) {
      failf(data, "Unable to receive SOCKS5 sub-negotiation response.");
      return CURLE_COULDNT_CONNECT;
    }

    /* ignore the first (VER) byte */
    if(socksreq[1] != 0) { /* status */
      failf(data, "User was rejected by the SOCKS5 server (%d %d).",
            socksreq[0], socksreq[1]);
      return CURLE_COULDNT_CONNECT;
    }

    /* Everything is good so far, user was authenticated! */
  }
  else {
    /* error */
    if(!allow_gssapi && (socksreq[1] == 1)) {
      failf(data,
            "SOCKS5 GSSAPI per-message authentication is not supported.");
      return CURLE_COULDNT_CONNECT;
    }
    if(socksreq[1] == 255) {
      if(!proxy_user || !*proxy_user) {
        failf(data,
              "No authentication method was acceptable. (It is quite likely"
              " that the SOCKS5 server wanted a username/password, since none"
              " was supplied to the server on this connection.)");
      }
      else {
        failf(data, "No authentication method was acceptable.");
      }
      return CURLE_COULDNT_CONNECT;
    }
    else {
      failf(data,
            "Undocumented SOCKS5 mode attempted to be used by server.");
      return CURLE_COULDNT_CONNECT;
    }
  }

  /* Authentication is complete, now specify destination to the proxy */
  len = 0;
  socksreq[len++] = 5; /* version (SOCKS5) */
  socksreq[len++] = 1; /* connect */
  socksreq[len++] = 0; /* must be zero */

  if(!socks5_resolve_local) {
    socksreq[len++] = 3; /* ATYP: domain name = 3 */
    socksreq[len++] = (char) hostname_len; /* address length */
    memcpy(&socksreq[len], hostname, hostname_len); /* address str w/o NULL */
    len += hostname_len;
  }
  else {
    struct Curl_dns_entry *dns;
    Curl_addrinfo *hp = NULL;
    int rc = Curl_resolv(conn, hostname, remote_port, FALSE, &dns);

    if(rc == CURLRESOLV_ERROR)
      return CURLE_COULDNT_RESOLVE_HOST;

    if(rc == CURLRESOLV_PENDING) {
      /* this requires that we're in "wait for resolve" state */
      code = Curl_resolver_wait_resolv(conn, &dns);
      if(code)
        return code;
    }

    /*
     * We cannot use 'hostent' as a struct that Curl_resolv() returns.  It
     * returns a Curl_addrinfo pointer that may not always look the same.
     */
    if(dns)
      hp = dns->addr;
    if(hp) {
      char buf[64];
      Curl_printable_address(hp, buf, sizeof(buf));

      if(hp->ai_family == AF_INET) {
        int i;
        struct sockaddr_in *saddr_in;
        socksreq[len++] = 1; /* ATYP: IPv4 = 1 */

        saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
        for(i = 0; i < 4; i++) {
          socksreq[len++] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[i];
        }

        infof(data, "SOCKS5 connect to IPv4 %s (locally resolved)\n", buf);
      }
#ifdef ENABLE_IPV6
      else if(hp->ai_family == AF_INET6) {
        int i;
        struct sockaddr_in6 *saddr_in6;
        socksreq[len++] = 4; /* ATYP: IPv6 = 4 */

        saddr_in6 = (struct sockaddr_in6 *)(void *)hp->ai_addr;
        for(i = 0; i < 16; i++) {
          socksreq[len++] =
            ((unsigned char *)&saddr_in6->sin6_addr.s6_addr)[i];
        }

        infof(data, "SOCKS5 connect to IPv6 %s (locally resolved)\n", buf);
      }
#endif
      else {
        hp = NULL; /* fail! */

        failf(data, "SOCKS5 connection to %s not supported\n", buf);
      }

      Curl_resolv_unlock(data, dns); /* not used anymore from now on */
    }
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS5 connect.",
            hostname);
      return CURLE_COULDNT_RESOLVE_HOST;
    }
  }